

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_addiupc(DisasContext_conflict6 *ctx,int rx,int imm,int is_64_bit,int extended)

{
  TCGContext_conflict6 *s;
  TCGTemp *a1;
  ulong uVar1;
  uintptr_t o;
  
  s = ctx->uc->tcg_ctx;
  if ((extended != 0) && ((ctx->hflags & 0x87f800) != 0)) {
    generate_exception_err(ctx,0x14,0);
    return;
  }
  a1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  uVar1 = 0;
  if ((ctx->hflags & 0x87f800) != 0) {
    uVar1 = (ulong)(ctx->hflags >> 0xe & 2) | 0xfffffffffffffffc;
  }
  tcg_gen_op2_mips64el
            (s,INDEX_op_movi_i64,(TCGArg)a1,uVar1 + (ctx->base).pc_next & 0xfffffffffffffffc);
  tcg_gen_addi_i64_mips64el(s,s->cpu_gpr[rx],(TCGv_i64)((long)a1 - (long)s),(long)imm);
  if (is_64_bit == 0) {
    tcg_gen_ext32s_i64_mips64el(s,s->cpu_gpr[rx],s->cpu_gpr[rx]);
  }
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)((TCGv_i64)((long)a1 - (long)s) + (long)s));
  return;
}

Assistant:

static void gen_addiupc(DisasContext *ctx, int rx, int imm,
                        int is_64_bit, int extended)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0;

    if (extended && (ctx->hflags & MIPS_HFLAG_BMASK)) {
        generate_exception_end(ctx, EXCP_RI);
        return;
    }

    t0 = tcg_temp_new(tcg_ctx);

    tcg_gen_movi_tl(tcg_ctx, t0, pc_relative_pc(ctx));
    tcg_gen_addi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rx], t0, imm);
    if (!is_64_bit) {
        tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rx], tcg_ctx->cpu_gpr[rx]);
    }

    tcg_temp_free(tcg_ctx, t0);
}